

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::LinkageException::~LinkageException(LinkageException *this)

{
  ~LinkageException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~LinkageException() throw()
		{
		}